

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_max(NeuralNetworkLayer *this)

{
  bool bVar1;
  MaxLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_max(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_max(this);
    this_00 = (MaxLayerParams *)operator_new(0x18);
    MaxLayerParams::MaxLayerParams(this_00);
    (this->layer_).max_ = this_00;
  }
  return (MaxLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MaxLayerParams* NeuralNetworkLayer::mutable_max() {
  if (!has_max()) {
    clear_layer();
    set_has_max();
    layer_.max_ = new ::CoreML::Specification::MaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.max)
  return layer_.max_;
}